

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O3

void __thiscall duckdb::CSVReaderOptions::SetDelimiter(CSVReaderOptions *this,string *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  InvalidInputException *this_00;
  string delim_str;
  string local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  string local_68;
  string local_48;
  
  pcVar2 = (input->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + input->_M_string_length);
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"\\t","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,anon_var_dwarf_63b940c + 7,anon_var_dwarf_63b940c + 8);
  StringUtil::Replace(&local_48,&local_68,&local_c8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48._M_string_length < 5) {
    local_a8[0] = local_98;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    if ((this->dialect_options).state_machine_options.delimiter.set_by_user == false) {
      ::std::__cxx11::string::_M_assign
                ((string *)&(this->dialect_options).state_machine_options.delimiter.value);
      (this->dialect_options).state_machine_options.delimiter.set_by_user = true;
    }
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"The delimiter option cannot exceed a size of 4 bytes.","");
  InvalidInputException::InvalidInputException(this_00,&local_c8);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVReaderOptions::SetDelimiter(const string &input) {
	auto delim_str = StringUtil::Replace(input, "\\t", "\t");
	if (delim_str.size() > 4) {
		throw InvalidInputException("The delimiter option cannot exceed a size of 4 bytes.");
	}
	this->dialect_options.state_machine_options.delimiter.Set(delim_str);
}